

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O3

string * __thiscall
helics::CoreApp::query_abi_cxx11_
          (string *__return_storage_ptr__,CoreApp *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  element_type *peVar1;
  string local_38;
  
  peVar1 = (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Core not available","",target._M_str,queryStr._M_len,
               queryStr._M_str);
    generateJsonErrorResponse((string *)__return_storage_ptr__,BAD_GATEWAY,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (*peVar1->_vptr_Core[0x5e])(__return_storage_ptr__,peVar1,target._M_len);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    CoreApp::query(std::string_view target, std::string_view queryStr, HelicsSequencingModes mode)
{
    return (core) ? core->query(target, queryStr, mode) :
                    generateJsonErrorResponse(JsonErrorCodes::BAD_GATEWAY, "Core not available");
}